

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

rb_node * rb_iter_traversal(rb_node *current_state,rb_node **next_state)

{
  rb_node *prVar1;
  rb_node *iter;
  rb_node **pprVar2;
  
  do {
    iter = current_state;
    if (iter == (rb_node *)0x0) {
      return iter;
    }
    current_state = iter->left;
  } while ((iter->left != (rb_node *)0x0) ||
          (current_state = iter->right, iter->right != (rb_node *)0x0));
  prVar1 = iter->parent;
  *next_state = prVar1;
  if (prVar1 == (rb_node *)0x0) {
    return iter;
  }
  if (prVar1->left == iter) {
    pprVar2 = &prVar1->left;
  }
  else {
    if (prVar1->right != iter) {
      return iter;
    }
    pprVar2 = &prVar1->right;
  }
  *pprVar2 = (rb_node *)0x0;
  return iter;
}

Assistant:

static struct rb_node *
rb_iter_traversal(struct rb_node *current_state, struct rb_node **next_state)
{
    struct rb_node *iter, *parent, *next;

    for (iter = current_state; iter; iter = next) {
        if (RBN_LEFT(iter)) {
            next = RBN_LEFT(iter);
            continue;
        } else if (RBN_RIGHT(iter)) {
            next = RBN_RIGHT(iter);
            continue;
        }

        *next_state = parent = RBN_PARENT(iter);

        if (parent && (RBN_LEFT(parent) == iter)) {
            RBN_LEFT(parent) = NULL;
        } else if (parent && (RBN_RIGHT(parent) == iter)) {
            RBN_RIGHT(parent) = NULL;
        }

        return iter;
    }

    return NULL;
}